

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

char * imap_atom(char *str)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  char *newstr;
  size_t newlen;
  long lStack_38;
  _Bool space_exists;
  size_t quote_count;
  size_t backsp_count;
  char *p2;
  char *p1;
  char *str_local;
  
  quote_count = 0;
  lStack_38 = 0;
  bVar1 = false;
  p2 = str;
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    for (; *p2 != '\0'; p2 = p2 + 1) {
      if (*p2 == '\\') {
        quote_count = quote_count + 1;
      }
      else if (*p2 == '\"') {
        lStack_38 = lStack_38 + 1;
      }
      else if (*p2 == ' ') {
        bVar1 = true;
      }
    }
    if (((quote_count != 0) || (lStack_38 != 0)) || (bVar1)) {
      sVar2 = strlen(str);
      iVar4 = 0;
      if (bVar1) {
        iVar4 = 2;
      }
      lVar3 = sVar2 + quote_count + lStack_38 + (long)iVar4;
      str_local = (char *)(*Curl_cmalloc)(lVar3 + 1);
      if (str_local == (char *)0x0) {
        str_local = (char *)0x0;
      }
      else {
        backsp_count = (size_t)str_local;
        p2 = str;
        if (bVar1) {
          *str_local = '\"';
          str_local[lVar3 + -1] = '\"';
          backsp_count = (size_t)(str_local + 1);
        }
        for (; *p2 != '\0'; p2 = p2 + 1) {
          if ((*p2 == '\\') || (*p2 == '\"')) {
            *(undefined1 *)backsp_count = 0x5c;
            backsp_count = backsp_count + 1;
          }
          *(char *)backsp_count = *p2;
          backsp_count = backsp_count + 1;
        }
        str_local[lVar3] = '\0';
      }
    }
    else {
      str_local = (*Curl_cstrdup)(str);
    }
  }
  return str_local;
}

Assistant:

static char *imap_atom(const char *str)
{
  const char *p1;
  char *p2;
  size_t backsp_count = 0;
  size_t quote_count = 0;
  bool space_exists = FALSE;
  size_t newlen = 0;
  char *newstr = NULL;

  if(!str)
    return NULL;

  /* Count any unescapped characters */
  p1 = str;
  while(*p1) {
    if(*p1 == '\\')
      backsp_count++;
    else if(*p1 == '"')
      quote_count++;
    else if(*p1 == ' ')
      space_exists = TRUE;

    p1++;
  }

  /* Does the input contain any unescapped characters? */
  if(!backsp_count && !quote_count && !space_exists)
    return strdup(str);

  /* Calculate the new string length */
  newlen = strlen(str) + backsp_count + quote_count + (space_exists ? 2 : 0);

  /* Allocate the new string */
  newstr = (char *) malloc((newlen + 1) * sizeof(char));
  if(!newstr)
    return NULL;

  /* Surround the string in quotes if necessary */
  p2 = newstr;
  if(space_exists) {
    newstr[0] = '"';
    newstr[newlen - 1] = '"';
    p2++;
  }

  /* Copy the string, escaping backslash and quote characters along the way */
  p1 = str;
  while(*p1) {
    if(*p1 == '\\' || *p1 == '"') {
      *p2 = '\\';
      p2++;
    }

   *p2 = *p1;

    p1++;
    p2++;
  }

  /* Terminate the string */
  newstr[newlen] = '\0';

  return newstr;
}